

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioButton.cpp
# Opt level: O2

shared_ptr<gui::RadioButton> __thiscall
gui::RadioButton::create(RadioButton *this,shared_ptr<gui::RadioButtonStyle> *style,String *name)

{
  RadioButton *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::RadioButton> sVar1;
  __shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = (RadioButton *)operator_new(0x2e8);
  std::__shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&style->super___shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2>
            );
  RadioButton(this_00,(shared_ptr<gui::RadioButtonStyle> *)&local_40,name);
  std::__shared_ptr<gui::RadioButton,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<gui::RadioButton,void>
            ((__shared_ptr<gui::RadioButton,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  sVar1.super___shared_ptr<gui::RadioButton,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::RadioButton,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::RadioButton>)
         sVar1.super___shared_ptr<gui::RadioButton,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<RadioButton> RadioButton::create(std::shared_ptr<RadioButtonStyle> style, const sf::String& name) {
    return std::shared_ptr<RadioButton>(new RadioButton(style, name));
}